

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O1

int __thiscall
duckdb::DecimalToString::DecimalLength<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale)

{
  int iVar1;
  int iVar2;
  DecimalToString *this_00;
  OutOfRangeException *this_01;
  int iVar3;
  int iVar4;
  ulong uVar5;
  hugeint_t value_00;
  hugeint_t value_01;
  string local_40;
  
  value_00.upper = value.upper;
  uVar5 = value.lower;
  iVar3 = 0;
  this_00 = this;
  if ((long)uVar5 < 0) {
    if (uVar5 == 0x8000000000000000 && this == (DecimalToString *)0x0) {
      this_01 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Negation of HUGEINT is out of range!","");
      OutOfRangeException::OutOfRangeException(this_01,&local_40);
      __cxa_throw(this_01,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (DecimalToString *)-(long)this;
    uVar5 = ~uVar5 + (ulong)(this == (DecimalToString *)0x0);
    iVar3 = 1;
  }
  if (width == '\0') {
    value_01.upper = value_00.upper;
    value_01.lower = uVar5;
    iVar2 = NumericHelper::UnsignedLength<duckdb::hugeint_t>((NumericHelper *)this_00,value_01);
  }
  else {
    iVar4 = width + 1 + (uint)(width < (byte)value.upper);
    value_00.lower = uVar5;
    iVar1 = NumericHelper::UnsignedLength<duckdb::hugeint_t>((NumericHelper *)this_00,value_00);
    iVar2 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar2 = iVar4;
    }
  }
  return iVar2 + iVar3;
}

Assistant:

int DecimalToString::DecimalLength(hugeint_t value, uint8_t width, uint8_t scale) {
	D_ASSERT(value > NumericLimits<hugeint_t>::Minimum());
	int negative;

	if (value.upper < 0) {
		Hugeint::NegateInPlace(value);
		negative = 1;
	} else {
		negative = 0;
	}
	if (scale == 0) {
		// scale is 0: regular number
		return NumericHelper::UnsignedLength(value) + negative;
	}
	// length is max of either:
	// scale + 2 OR
	// integer length + 1
	// scale + 2 happens when the number is in the range of (-1, 1)
	// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
	// integer length + 1 happens when the number is outside of that range
	// in that case we print the integer number, but with one extra character ('.')
	auto extra_numbers = width > scale ? 2 : 1;
	return MaxValue(scale + extra_numbers, NumericHelper::UnsignedLength(value) + 1) + negative;
}